

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O1

void __thiscall
duckdb::BindContext::RemoveContext(BindContext *this,vector<duckdb::BindingAlias,_true> *aliases)

{
  BindingAlias *this_00;
  BindingAlias *pBVar1;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *puVar2;
  _Head_base<0UL,_duckdb::Binding_*,_false> _Var3;
  _Head_base<0UL,_duckdb::Binding_*,_false> _Var4;
  long lVar5;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var6;
  bool bVar7;
  pointer pBVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *removed_col;
  _Hash_node_base *p_Var9;
  iterator __first;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_01;
  _Hash_node_base *p_Var10;
  long lVar11;
  iterator __first_00;
  pointer this_02;
  pointer other;
  BindingAlias *pBVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  removed_using_columns;
  case_insensitive_map_t<reference_set_t<UsingColumnSet>_> *__range2;
  long local_78;
  long lStack_70;
  undefined8 local_68;
  vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_true>
  *local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_50;
  pointer local_48;
  value_type *local_40;
  _Hash_node_base *local_38;
  
  other = (aliases->super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>).
          super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_48 = (aliases->super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>).
             super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (other != local_48) {
    local_50 = &(this->using_columns)._M_h;
    local_58 = &this->bindings_list;
    do {
      local_78 = 0;
      lStack_70 = 0;
      local_68 = 0;
      for (p_Var10 = (this->using_columns)._M_h._M_before_begin._M_nxt; p_Var6 = local_50,
          lVar5 = lStack_70, lVar11 = local_78, p_Var10 != (_Hash_node_base *)0x0;
          p_Var10 = p_Var10->_M_nxt) {
        p_Var9 = p_Var10[7]._M_nxt;
        if (p_Var9 != (_Hash_node_base *)0x0) {
          local_40 = (value_type *)(p_Var10 + 1);
          do {
            this_00 = (BindingAlias *)p_Var9[1]._M_nxt;
            pBVar12 = (BindingAlias *)this_00[1].catalog._M_dataplus._M_p;
            pBVar1 = (BindingAlias *)this_00[1].catalog._M_string_length;
            lVar11 = ((long)pBVar1 - (long)pBVar12 >> 5) * -0x5555555555555555 >> 2;
            local_38 = p_Var9;
            if (0 < lVar11) {
              lVar11 = lVar11 + 1;
              do {
                bVar7 = BindingAlias::operator==(pBVar12,other);
                __first._M_current = pBVar12;
                if (bVar7) goto LAB_00e41fe1;
                bVar7 = BindingAlias::operator==(pBVar12 + 1,other);
                __first._M_current = pBVar12 + 1;
                if (bVar7) goto LAB_00e41fe1;
                bVar7 = BindingAlias::operator==(pBVar12 + 2,other);
                __first._M_current = pBVar12 + 2;
                if (bVar7) goto LAB_00e41fe1;
                bVar7 = BindingAlias::operator==(pBVar12 + 3,other);
                __first._M_current = pBVar12 + 3;
                if (bVar7) goto LAB_00e41fe1;
                pBVar12 = pBVar12 + 4;
                lVar11 = lVar11 + -1;
              } while (1 < lVar11);
            }
            lVar11 = ((long)pBVar1 - (long)pBVar12 >> 5) * -0x5555555555555555;
            if (lVar11 == 1) {
LAB_00e41fc4:
              bVar7 = BindingAlias::operator==(pBVar12,other);
              __first._M_current = pBVar12;
              if (!bVar7) {
                __first._M_current = pBVar1;
              }
            }
            else if (lVar11 == 2) {
LAB_00e41fb1:
              bVar7 = BindingAlias::operator==(pBVar12,other);
              __first._M_current = pBVar12;
              if (!bVar7) {
                pBVar12 = pBVar12 + 1;
                goto LAB_00e41fc4;
              }
            }
            else {
              __first._M_current = pBVar1;
              if ((lVar11 == 3) &&
                 (bVar7 = BindingAlias::operator==(pBVar12,other), __first._M_current = pBVar12,
                 !bVar7)) {
                pBVar12 = pBVar12 + 1;
                goto LAB_00e41fb1;
              }
            }
LAB_00e41fe1:
            pBVar12 = __first._M_current + 1;
            if (pBVar12 != pBVar1 && __first._M_current != pBVar1) {
              do {
                bVar7 = BindingAlias::operator==(pBVar12,other);
                if (!bVar7) {
                  ::std::__cxx11::string::operator=((string *)__first._M_current,(string *)pBVar12);
                  ::std::__cxx11::string::operator=
                            ((string *)&(__first._M_current)->schema,(string *)&pBVar12->schema);
                  ::std::__cxx11::string::operator=
                            ((string *)&(__first._M_current)->alias,(string *)&pBVar12->alias);
                  __first._M_current = __first._M_current + 1;
                }
                pBVar12 = pBVar12 + 1;
              } while (pBVar12 != pBVar1);
            }
            ::std::vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>::_M_erase
                      ((vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_> *)
                       (this_00 + 1),__first,(BindingAlias *)this_00[1].catalog._M_string_length);
            p_Var9 = local_38;
            if ((this_00[1].catalog._M_dataplus._M_p == (pointer)this_00[1].catalog._M_string_length
                ) || (bVar7 = BindingAlias::operator==(this_00,other), bVar7)) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_78,local_40);
            }
            p_Var9 = p_Var9->_M_nxt;
          } while (p_Var9 != (_Hash_node_base *)0x0);
        }
      }
      for (; lVar11 != lVar5; lVar11 = lVar11 + 0x20) {
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(p_Var6,lVar11);
      }
      this_02 = (this->bindings_list).
                super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->bindings_list).
               super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = (long)puVar2 - (long)this_02 >> 5;
      if (0 < lVar11) {
        lVar11 = lVar11 + 1;
        do {
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_02);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          __first_00._M_current = this_02;
          if (bVar7) goto LAB_00e421f0;
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_02 + 1);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          __first_00._M_current = this_02 + 1;
          if (bVar7) goto LAB_00e421f0;
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_02 + 2);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          __first_00._M_current = this_02 + 2;
          if (bVar7) goto LAB_00e421f0;
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_02 + 3);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          __first_00._M_current = this_02 + 3;
          if (bVar7) goto LAB_00e421f0;
          this_02 = this_02 + 4;
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
      }
      lVar11 = (long)puVar2 - (long)this_02 >> 3;
      if (lVar11 == 1) {
LAB_00e421d0:
        pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_02);
        bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
        __first_00._M_current = this_02;
        if (!bVar7) {
          __first_00._M_current = puVar2;
        }
      }
      else if (lVar11 == 2) {
LAB_00e421b1:
        pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator->
                           (this_02);
        bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
        __first_00._M_current = this_02;
        if (!bVar7) {
          this_02 = this_02 + 1;
          goto LAB_00e421d0;
        }
      }
      else {
        __first_00._M_current = puVar2;
        if (lVar11 == 3) {
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_02);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          __first_00._M_current = this_02;
          if (!bVar7) {
            this_02 = this_02 + 1;
            goto LAB_00e421b1;
          }
        }
      }
LAB_00e421f0:
      this_01 = __first_00._M_current + 1;
      if (this_01 != puVar2 && __first_00._M_current != puVar2) {
        do {
          pBVar8 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::
                   operator->(this_01);
          bVar7 = BindingAlias::operator==(&pBVar8->alias,other);
          if (!bVar7) {
            _Var3._M_head_impl =
                 (this_01->super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)
                 ._M_t.super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                 super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
            (this_01->super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t
            .super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
            super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl = (Binding *)0x0;
            _Var4._M_head_impl =
                 ((__first_00._M_current)->
                 super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
                 super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
                 super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
                 super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl;
            ((__first_00._M_current)->
            super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>)._M_t.
            super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>.
            super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl = _Var3._M_head_impl;
            if (_Var4._M_head_impl != (Binding *)0x0) {
              (**(code **)((long)(_Var4._M_head_impl)->_vptr_Binding + 8))();
            }
            __first_00._M_current = __first_00._M_current + 1;
          }
          this_01 = this_01 + 1;
        } while (this_01 != puVar2);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ::_M_erase(&local_58->
                  super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 ,__first_00,
                 (this->bindings_list).
                 super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
      other = other + 1;
    } while (other != local_48);
  }
  return;
}

Assistant:

void BindContext::RemoveContext(const vector<BindingAlias> &aliases) {
	for (auto &alias : aliases) {
		// remove the binding from any USING columns
		vector<string> removed_using_columns;
		for (auto &using_sets : using_columns) {
			for (auto &using_set_ref : using_sets.second) {
				auto &using_set = using_set_ref.get();
				auto it = std::remove_if(using_set.bindings.begin(), using_set.bindings.end(),
				                         [&](const BindingAlias &using_alias) { return using_alias == alias; });
				using_set.bindings.erase(it, using_set.bindings.end());
				if (using_set.bindings.empty() || using_set.primary_binding == alias) {
					// if the using column is no longer referred to - remove it entirely
					removed_using_columns.push_back(using_sets.first);
				}
			}
		}
		for (auto &removed_col : removed_using_columns) {
			using_columns.erase(removed_col);
		}

		// remove the binding from the list of bindings
		auto it = std::remove_if(bindings_list.begin(), bindings_list.end(),
		                         [&](unique_ptr<Binding> &x) { return x->alias == alias; });
		bindings_list.erase(it, bindings_list.end());
	}
}